

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_red.c
# Opt level: O3

void zzRedCrandMont(word *a,word *mod,size_t n,word mont_param,void *stack)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  size_t sVar4;
  ulong uVar5;
  word wVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (n == 0) {
    uVar8 = 0;
    wVar6 = zzSubW2(a + 1,0xffffffffffffffff,0);
    uVar9 = 0;
  }
  else {
    wVar6 = *a;
    sVar4 = 0;
    uVar7 = 0;
    uVar8 = 0;
    do {
      uVar5 = wVar6 * mont_param;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar5;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = -*mod;
      puVar1 = a + n + sVar4;
      uVar9 = *puVar1;
      *puVar1 = *puVar1 + uVar5 + uVar8;
      uVar8 = (ulong)(CARRY8(uVar9,uVar5 + uVar8) || CARRY8(uVar5,uVar8));
      uVar9 = SUB168(auVar2 * auVar3,8) + uVar7;
      uVar7 = a[sVar4 + 1];
      wVar6 = uVar7 - uVar9;
      a[sVar4 + 1] = wVar6;
      sVar4 = sVar4 + 1;
      uVar7 = (ulong)(uVar7 < uVar9);
    } while (n != sVar4);
    wVar6 = zzSubW2(a + n + 1,n - 1,uVar7);
    sVar4 = 0;
    do {
      uVar7 = a[n + sVar4];
      a[sVar4] = uVar7;
      uVar9 = (ulong)(mod[sVar4] < uVar7) | (ulong)((uint)uVar9 & (uint)(mod[sVar4] == uVar7));
      sVar4 = sVar4 + 1;
    } while (n != sVar4);
  }
  zzSubAndW(a,mod,n,-(uVar8 - wVar6 | uVar9));
  return;
}

Assistant:

void SAFE(zzRedCrandMont)(word a[], const word mod[], size_t n, 
	register word mont_param, void* stack)
{
	register word carry = 0;
	register word borrow = 0;
	register word w = 0;
	register dword prod;
	size_t i;
	// pre
	ASSERT(wwIsDisjoint2(a, 2 * n, mod, n));
	ASSERT(n >= 2 && mod[0] % 2  && wwIsRepW(mod + 1, n - 1, WORD_MAX));
	ASSERT((word)(mod[0] * mont_param + 1) == 0);
	// редукция
	for (i = 0; i < n; ++i)
	{
		zzMul11Lo(w, a[i], mont_param);
		zzMul11(prod, w, WORD_0 - mod[0]);
		w += carry;
		carry = wordLess01(w, carry);
		a[i + n] += w;
		carry |= wordLess01(a[i + n], w); 
		w = (word)(prod >> B_PER_W);
		w += borrow;
		borrow = wordLess01(w, borrow);
		borrow |= wordLess01(a[i + 1], w);
		a[i + 1] -= w;
	}
	// a <- a - borrow * B^{n + 1}
	carry -= zzSubW2(a + n + 1, n - 1, borrow);
	// a <- a / B^n, a >= mod?
	for (i = 0; i < n; ++i)
	{
		a[i] = a[n + i];
		w &= wordEq01(mod[i], a[i]);
		w |= wordLess01(mod[i], a[i]);
	}
	w |= carry, w = WORD_0 - w;
	zzSubAndW(a, mod, n, w);
	// очистка
	prod = 0;
	carry = borrow = w = 0;
}